

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O1

int find_nal_unit(uint8_t *buf,int size,int *nal_start,int *nal_end)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = 0;
  *nal_start = 0;
  *nal_end = 0;
  iVar1 = 5;
  if (5 < size) {
    iVar1 = size;
  }
  while ((buf[uVar2] != '\0' ||
         (((buf[uVar2 + 1] != '\0' || (buf[uVar2 + 2] != '\x01')) &&
          ((buf[uVar2 + 1] != '\0' || ((buf[uVar2 + 2] != '\0' || (buf[uVar2 + 3] != '\x01')))))))))
  {
    uVar2 = uVar2 + 1;
    if (iVar1 - 4 == uVar2) {
      return 0;
    }
  }
  if ((buf[uVar2 + 1] != '\0') || (buf[uVar2 + 2] != '\x01')) {
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  iVar1 = (int)uVar2;
  if (((buf[iVar1] == '\0') && (buf[(long)iVar1 + 1] == '\0')) && (buf[(long)iVar1 + 2] == '\x01'))
  {
    iVar1 = iVar1 + 3;
    *nal_start = iVar1;
    lVar3 = (uVar2 & 0xffffffff) + 2;
    while ((buf[lVar3 + 1] != '\0' ||
           (((buf[lVar3 + 2] != '\0' || (buf[lVar3 + 3] != '\0')) &&
            ((buf[lVar3 + 2] != '\0' || (buf[lVar3 + 3] != '\x01'))))))) {
      iVar1 = iVar1 + 1;
      lVar3 = lVar3 + 1;
      if ((long)size + -4 <= lVar3) {
        *nal_end = size;
        return -1;
      }
    }
    *nal_end = iVar1;
    return iVar1 - *nal_start;
  }
  return 0;
}

Assistant:

int find_nal_unit(uint8_t* buf, int size, int* nal_start, int* nal_end)
{
    int i;
    // find start
    *nal_start = 0;
    *nal_end = 0;

    i = 0;
    while (   //( next_bits( 24 ) != 0x000001 && next_bits( 32 ) != 0x00000001 )
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01) &&
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0 || buf[i+3] != 0x01)
            )
    {
        i++; // skip leading zero
        if (i+4 >= size) { return 0; } // did not find nal start
    }

    if  (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01) // ( next_bits( 24 ) != 0x000001 )
    {
        i++;
    }

    if  (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01) { /* error, should never happen */ return 0; }
    i+= 3;
    *nal_start = i;

    while (   //( next_bits( 24 ) != 0x000000 && next_bits( 24 ) != 0x000001 )
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0) &&
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01)
            )
    {
        i++;
        // FIXME the next line fails when reading a nal that ends exactly at the end of the data
        if (i+3 >= size) { *nal_end = size; return -1; } // did not find nal end, stream ended first
    }

    *nal_end = i;
    return (*nal_end - *nal_start);
}